

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int av1_vector_match(int16_t *ref,int16_t *src,int bwl,int search_size,int full_search,int *sad)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int16_t *piVar7;
  int iVar8;
  uint uVar9;
  
  uVar1 = search_size * 2;
  if (full_search == 0) {
    iVar8 = 0x7fffffff;
    uVar5 = 0;
    piVar7 = ref;
    for (uVar4 = 0; (long)uVar4 <= (long)(int)uVar1; uVar4 = uVar4 + 0x10) {
      iVar2 = (*aom_vector_var)(piVar7,src,bwl);
      if (iVar2 < iVar8) {
        uVar5 = uVar4 & 0xffffffff;
        iVar8 = iVar2;
      }
      piVar7 = piVar7 + 0x10;
    }
    uVar4 = uVar5;
    for (iVar2 = -8; iVar2 < 9; iVar2 = iVar2 + 0x10) {
      uVar9 = (int)uVar5 + iVar2;
      if (((int)uVar9 <= (int)uVar1 && -1 < (int)uVar9) &&
         (iVar3 = (*aom_vector_var)(ref + uVar9,src,bwl), iVar3 < iVar8)) {
        uVar4 = (ulong)uVar9;
        iVar8 = iVar3;
      }
    }
    uVar5 = uVar4;
    for (iVar2 = -4; iVar2 < 5; iVar2 = iVar2 + 8) {
      uVar9 = (int)uVar4 + iVar2;
      if (((int)uVar9 <= (int)uVar1 && -1 < (int)uVar9) &&
         (iVar3 = (*aom_vector_var)(ref + uVar9,src,bwl), iVar3 < iVar8)) {
        uVar5 = (ulong)uVar9;
        iVar8 = iVar3;
      }
    }
    uVar4 = uVar5;
    for (iVar2 = -2; iVar2 < 3; iVar2 = iVar2 + 4) {
      uVar9 = (int)uVar5 + iVar2;
      if (((int)uVar9 <= (int)uVar1 && -1 < (int)uVar9) &&
         (iVar3 = (*aom_vector_var)(ref + uVar9,src,bwl), iVar3 < iVar8)) {
        uVar4 = (ulong)uVar9;
        iVar8 = iVar3;
      }
    }
    uVar5 = uVar4;
    for (iVar2 = -1; iVar3 = (int)uVar5, iVar2 < 2; iVar2 = iVar2 + 2) {
      uVar9 = (int)uVar4 + iVar2;
      if (((int)uVar9 <= (int)uVar1 && -1 < (int)uVar9) &&
         (iVar3 = (*aom_vector_var)(ref + uVar9,src,bwl), iVar3 < iVar8)) {
        uVar5 = (ulong)uVar9;
        iVar8 = iVar3;
      }
    }
  }
  else {
    uVar4 = 0;
    uVar5 = (ulong)(uVar1 | 1);
    if ((int)(uVar1 | 1) < 1) {
      uVar5 = uVar4;
    }
    iVar8 = 0x7fffffff;
    uVar6 = 0;
    for (; iVar3 = (int)uVar6, uVar5 != uVar4; uVar4 = uVar4 + 1) {
      iVar2 = (*aom_vector_var)(ref,src,bwl);
      if (iVar2 < iVar8) {
        uVar6 = uVar4 & 0xffffffff;
        iVar8 = iVar2;
      }
      ref = ref + 1;
    }
  }
  *sad = iVar8;
  return iVar3 - ((int)uVar1 >> 1);
}

Assistant:

int av1_vector_match(const int16_t *ref, const int16_t *src, int bwl,
                     int search_size, int full_search, int *sad) {
  int best_sad = INT_MAX;
  int this_sad;
  int d;
  int center, offset = 0;
  int bw = search_size << 1;

  if (full_search) {
    for (d = 0; d <= bw; d++) {
      this_sad = aom_vector_var(&ref[d], src, bwl);
      if (this_sad < best_sad) {
        best_sad = this_sad;
        offset = d;
      }
    }
    center = offset;
    *sad = best_sad;
    return (center - (bw >> 1));
  }

  for (d = 0; d <= bw; d += 16) {
    this_sad = aom_vector_var(&ref[d], src, bwl);
    if (this_sad < best_sad) {
      best_sad = this_sad;
      offset = d;
    }
  }
  center = offset;

  for (d = -8; d <= 8; d += 16) {
    int this_pos = offset + d;
    // check limit
    if (this_pos < 0 || this_pos > bw) continue;
    this_sad = aom_vector_var(&ref[this_pos], src, bwl);
    if (this_sad < best_sad) {
      best_sad = this_sad;
      center = this_pos;
    }
  }
  offset = center;

  for (d = -4; d <= 4; d += 8) {
    int this_pos = offset + d;
    // check limit
    if (this_pos < 0 || this_pos > bw) continue;
    this_sad = aom_vector_var(&ref[this_pos], src, bwl);
    if (this_sad < best_sad) {
      best_sad = this_sad;
      center = this_pos;
    }
  }
  offset = center;

  for (d = -2; d <= 2; d += 4) {
    int this_pos = offset + d;
    // check limit
    if (this_pos < 0 || this_pos > bw) continue;
    this_sad = aom_vector_var(&ref[this_pos], src, bwl);
    if (this_sad < best_sad) {
      best_sad = this_sad;
      center = this_pos;
    }
  }
  offset = center;

  for (d = -1; d <= 1; d += 2) {
    int this_pos = offset + d;
    // check limit
    if (this_pos < 0 || this_pos > bw) continue;
    this_sad = aom_vector_var(&ref[this_pos], src, bwl);
    if (this_sad < best_sad) {
      best_sad = this_sad;
      center = this_pos;
    }
  }
  *sad = best_sad;
  return (center - (bw >> 1));
}